

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O2

int tchecker::zg::path::concrete::lexical_cmp(edge_t *e1,edge_t *e2)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  rational<long> local_38;
  rational<long> local_28;
  
  iVar2 = symbolic::lexical_cmp(&e1->super_edge_t,&e2->super_edge_t);
  if (iVar2 == 0) {
    local_28.num = (e1->_delay).num;
    local_28.den = (e1->_delay).den;
    local_38.num = (e2->_delay).num;
    local_38.den = (e2->_delay).den;
    bVar1 = boost::rational<long>::operator<(&local_28,&local_38);
    if (bVar1) {
      uVar3 = 0xffffffff;
    }
    else {
      bVar1 = boost::rational<long>::operator<(&local_38,&local_28);
      uVar3 = (uint)bVar1;
    }
  }
  else {
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int lexical_cmp(tchecker::zg::path::concrete::edge_t const & e1, tchecker::zg::path::concrete::edge_t const & e2)
{
  int cmp = tchecker::zg::path::symbolic::lexical_cmp(e1, e2);
  if (cmp != 0)
    return cmp;
  tchecker::clock_rational_value_t const d1 = e1.delay(), d2 = e2.delay();
  if (d1 < d2)
    return -1;
  if (d1 > d2)
    return 1;
  return 0;
}